

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedArray.cpp
# Opt level: O3

void __thiscall
CompressedArray::CompressedArray
          (CompressedArray *this,vector<Record,_std::allocator<Record>_> *sorted_records)

{
  vector<bool,_std::allocator<bool>_> *__x;
  pointer *ppBVar1;
  uint uVar2;
  iterator __position;
  _Bit_type *p_Var3;
  _Bit_type *p_Var4;
  Key KVar5;
  _Bit_pointer puVar6;
  pointer pBVar7;
  pointer pBVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  _Bvector_impl *p_Var11;
  uint32_t record_index;
  _Bit_type *p_Var12;
  _Bit_type *p_Var13;
  ulong uVar14;
  BlockHeader header;
  vector<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_> local_a8;
  uint uStack_90;
  undefined4 uStack_8c;
  _Bit_pointer local_88;
  undefined1 local_78 [16];
  pointer local_68;
  uint uStack_60;
  undefined4 uStack_5c;
  _Bit_pointer local_58;
  vector<Record,_std::allocator<Record>_> local_48;
  
  (this->super_Serializable)._vptr_Serializable = (_func_int **)&PTR_dump_0014ecf8;
  __x = &this->data;
  (this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  (this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
  .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
  .super__Bit_iterator_base._M_offset = 0;
  (this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  (this->headers).
  super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->headers).
  super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->headers).
  super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ngram_count_values).super_Serializable._vptr_Serializable =
       (_func_int **)&PTR_dump_0014dde8;
  (this->ngram_count_values).words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ngram_count_values).words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ngram_count_values).words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->continuations_count_values).super_Serializable._vptr_Serializable =
       (_func_int **)&PTR_dump_0014dde8;
  (this->continuations_count_values).words.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->continuations_count_values).words.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->continuations_count_values).words.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->unique_continuations_count_values).super_Serializable._vptr_Serializable =
       (_func_int **)&PTR_dump_0014dde8;
  (this->unique_continuations_count_values).words.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->unique_continuations_count_values).words.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->unique_continuations_count_values).words.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<Record,_std::allocator<Record>_>::vector(&local_48,sorted_records);
  store_values(this,&local_48);
  if (local_48.super__Vector_base<Record,_std::allocator<Record>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<Record,_std::allocator<Record>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  this->record_count =
       (int)((ulong)((long)(sorted_records->super__Vector_base<Record,_std::allocator<Record>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(sorted_records->super__Vector_base<Record,_std::allocator<Record>_>).
                          _M_impl.super__Vector_impl_data._M_start) >> 2) * -0x33333333;
  find_best_radix_parameters(this,sorted_records);
  if (this->record_count != 0) {
    p_Var13 = (this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    p_Var12 = (this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
    uVar14 = (ulong)(this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
    record_index = 0;
    do {
      local_a8.
      super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
      ._M_impl.super__Vector_impl_data._M_start =
           *(pointer *)
            &(sorted_records->super__Vector_base<Record,_std::allocator<Record>_>)._M_impl.
             super__Vector_impl_data._M_start[record_index].key;
      local_a8.
      super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)CONCAT44((int)uVar14 + ((int)p_Var12 - (int)p_Var13) * 8,record_index);
      __position._M_current =
           (this->headers).
           super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->headers).
          super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<CompressedArray::BlockHeader,std::allocator<CompressedArray::BlockHeader>>::
        _M_realloc_insert<CompressedArray::BlockHeader_const&>
                  ((vector<CompressedArray::BlockHeader,std::allocator<CompressedArray::BlockHeader>>
                    *)&this->headers,__position,(BlockHeader *)&local_a8);
      }
      else {
        (__position._M_current)->key =
             (Key)local_a8.
                  super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        *(pointer *)&(__position._M_current)->record_index =
             local_a8.
             super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        ppBVar1 = &(this->headers).
                   super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppBVar1 = *ppBVar1 + 1;
      }
      p_Var3 = (this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      p_Var4 = (this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
      uVar2 = (this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
      record_index = fill_block(this,sorted_records,record_index);
      p_Var13 = (this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      p_Var12 = (this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
      uVar14 = (ulong)(this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
      if (0x400 < (uVar14 - uVar2) +
                  ((long)p_Var12 + ((long)p_Var3 - ((long)p_Var4 + (long)p_Var13))) * 8) {
        __assert_fail("new_size - old_size <= max_block_size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/pavellevap[P]ngram_storage/src/CompressedArray.cpp"
                      ,0x1b,"CompressedArray::CompressedArray(vector<Record>)");
      }
    } while (record_index < this->record_count);
  }
  std::vector<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>::vector
            (&local_a8,&this->headers);
  KVar5 = (Key)(this->headers).
               super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
               ._M_impl.super__Vector_impl_data._M_start;
  pBVar7 = (this->headers).
           super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pBVar8 = (this->headers).
           super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->headers).
  super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_a8.
       super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->headers).
  super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_a8.
       super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->headers).
  super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_a8.
       super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_a8.
  super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)KVar5;
  local_a8.
  super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>.
  _M_impl.super__Vector_impl_data._M_finish = pBVar7;
  local_a8.
  super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = pBVar8;
  if (KVar5 != (Key)0x0) {
    operator_delete((void *)KVar5);
  }
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_78,__x);
  local_88 = local_58;
  local_a8.
  super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = local_68;
  uStack_90 = uStack_60;
  uStack_8c = uStack_5c;
  local_a8.
  super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)local_78._0_8_;
  local_a8.
  super__Vector_base<CompressedArray::BlockHeader,_std::allocator<CompressedArray::BlockHeader>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)local_78._8_8_;
  puVar6 = (this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_end_of_storage;
  p_Var13 = (__x->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p;
  p_Var11 = &(this->data).super__Bvector_base<std::allocator<bool>_>._M_impl;
  uVar9._0_4_ = (p_Var11->super__Bvector_impl_data)._M_start.super__Bit_iterator_base._M_offset;
  uVar9._4_4_ = *(undefined4 *)
                 &(p_Var11->super__Bvector_impl_data)._M_start.super__Bit_iterator_base.field_0xc;
  p_Var12 = (this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
            ._M_finish.super__Bit_iterator_base._M_p;
  p_Var11 = &(this->data).super__Bvector_base<std::allocator<bool>_>._M_impl;
  uVar10._0_4_ = (p_Var11->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_offset;
  uVar10._4_4_ = *(undefined4 *)
                  &(p_Var11->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base.field_0xc;
  (this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = local_58;
  (this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
  .super__Bit_iterator_base._M_p = (_Bit_type *)local_68;
  p_Var11 = &(this->data).super__Bvector_base<std::allocator<bool>_>._M_impl;
  (p_Var11->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_offset = uStack_60;
  *(undefined4 *)&(p_Var11->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base.field_0xc =
       uStack_5c;
  (__x->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)local_78._0_8_;
  *(undefined8 *)
   &(this->data).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_offset = local_78._8_8_;
  if (p_Var13 != (_Bit_type *)0x0) {
    local_78._0_8_ = p_Var13;
    local_78._8_8_ = uVar9;
    local_68 = (pointer)p_Var12;
    _uStack_60 = uVar10;
    local_58 = puVar6;
    operator_delete(p_Var13);
  }
  return;
}

Assistant:

CompressedArray::CompressedArray(vector<Record> sorted_records) {
    store_values(sorted_records);
    record_count = uint32_t(sorted_records.size());
    find_best_radix_parameters(sorted_records);

    uint32_t record_index = 0;
    while (record_index < record_count) {
        BlockHeader header;
        header.key = sorted_records[record_index].key;
        header.record_index = record_index;
        header.offset = uint32_t(data.size());
        headers.push_back(header);

        size_t old_size = data.size();
        record_index = fill_block(sorted_records, record_index);
        size_t new_size = data.size();
        assert(new_size - old_size <= max_block_size);
    }
    vector<BlockHeader>(headers).swap(headers);
    vector<bool>(data).swap(data);
}